

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

string * __thiscall
duckdb::AddConstraintInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,AddConstraintInfo *this)

{
  pointer pCVar1;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"ALTER TABLE ","");
  ParseInfo::QualifierToString
            (&local_40,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pCVar1 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator->
                     (&this->constraint);
  (*pCVar1->_vptr_Constraint[2])(&local_40,pCVar1);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string AddConstraintInfo::ToString() const {
	string result = "ALTER TABLE ";
	result += QualifierToString(catalog, schema, name);
	result += " ADD ";
	result += constraint->ToString();
	result += ";";
	return result;
}